

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver-c.cc
# Opt level: O2

NLW2_NLSolution_C *
NLW2_WrapNLSOL_Solution_C
          (NLW2_NLSolution_C *__return_storage_ptr__,NLW2_NLSolver_C *nlse,NLSolution *sol)

{
  size_type __n;
  pointer pNVar1;
  pointer pdVar2;
  int iVar3;
  NLW2_Solution_C_Data *this;
  _Base_ptr p_Var4;
  NLSolution *sol_1;
  NLW2_NLSuffix_C suf_c;
  NLW2_NLSuffix_C local_50;
  
  this = (NLW2_Solution_C_Data *)nlse->p_sol_;
  if (this == (NLW2_Solution_C_Data *)0x0) {
    this = (NLW2_Solution_C_Data *)operator_new(0xa8);
    mp::NLW2_Solution_C_Data::NLW2_Solution_C_Data(this);
    nlse->p_sol_ = this;
  }
  mp::NLSolution::operator=(&this->sol_,sol);
  __n = (this->sol_).suffixes_.
        super_set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>._M_t._M_impl
        .super__Rb_tree_header._M_node_count;
  __return_storage_ptr__->nsuf_ = (int)__n;
  __return_storage_ptr__->obj_val_ = (this->sol_).obj_val_;
  __return_storage_ptr__->solve_message_ = (this->sol_).solve_message_._M_dataplus._M_p;
  iVar3 = (this->sol_).nbs_;
  __return_storage_ptr__->solve_result_ = (this->sol_).solve_result_;
  __return_storage_ptr__->nbs_ = iVar3;
  pNVar1 = (this->suffixes_).super__Vector_base<NLW2_NLSuffix_C,_std::allocator<NLW2_NLSuffix_C>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->suffixes_).super__Vector_base<NLW2_NLSuffix_C,_std::allocator<NLW2_NLSuffix_C>_>.
      _M_impl.super__Vector_impl_data._M_finish != pNVar1) {
    (this->suffixes_).super__Vector_base<NLW2_NLSuffix_C,_std::allocator<NLW2_NLSuffix_C>_>._M_impl.
    super__Vector_impl_data._M_finish = pNVar1;
  }
  std::vector<NLW2_NLSuffix_C,_std::allocator<NLW2_NLSuffix_C>_>::reserve(&this->suffixes_,__n);
  __return_storage_ptr__->suffixes_ =
       (this->suffixes_).super__Vector_base<NLW2_NLSuffix_C,_std::allocator<NLW2_NLSuffix_C>_>.
       _M_impl.super__Vector_impl_data._M_start;
  for (p_Var4 = *(_Base_ptr *)
                 ((long)&(this->sol_).suffixes_.
                         super_set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
                         ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
      (_Rb_tree_header *)p_Var4 !=
      &(this->sol_).suffixes_.
       super_set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>._M_t._M_impl.
       super__Rb_tree_header; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    local_50.kind_ = p_Var4[3]._M_color;
    local_50.name_ = *(char **)(p_Var4 + 1);
    local_50.table_ = *(char **)(p_Var4 + 2);
    local_50.values_ = (double *)p_Var4[3]._M_parent;
    local_50.numval_ = (int)((ulong)((long)p_Var4[3]._M_left - (long)local_50.values_) >> 3);
    std::vector<NLW2_NLSuffix_C,_std::allocator<NLW2_NLSuffix_C>_>::emplace_back<NLW2_NLSuffix_C>
              (&this->suffixes_,&local_50);
  }
  pdVar2 = (this->sol_).x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  __return_storage_ptr__->n_primal_values_ =
       (int)((ulong)((long)(this->sol_).x_.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2) >> 3);
  __return_storage_ptr__->x_ = pdVar2;
  pdVar2 = (this->sol_).y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  __return_storage_ptr__->n_dual_values_ =
       (int)((ulong)((long)(this->sol_).y_.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2) >> 3);
  __return_storage_ptr__->y_ = pdVar2;
  return __return_storage_ptr__;
}

Assistant:

static NLW2_NLSolution_C NLW2_WrapNLSOL_Solution_C
(NLW2_NLSolver_C* nlse, mp::NLSolution sol) {
  // Store the C++ data
  if (!nlse->p_sol_)
    nlse->p_sol_ = new mp::NLW2_Solution_C_Data;
  auto& sol_data = *CastNZ<mp::NLW2_Solution_C_Data>(nlse->p_sol_);
  sol_data.sol_ = std::move(sol);

  NLW2_NLSolution_C result;
  {
    const auto& sol=sol_data.sol_;
    result.nbs_ = sol.nbs_;
    result.nsuf_ = sol.suffixes_.size();
    result.obj_val_ = sol.obj_val_;
    result.solve_message_ = sol.solve_message_.c_str();
    result.solve_result_ = sol.solve_result_;
    sol_data.suffixes_.clear();
    sol_data.suffixes_.reserve(sol.suffixes_.size());
    result.suffixes_ = sol_data.suffixes_.data();
    for (const auto& suf: sol.suffixes_) {
      NLW2_NLSuffix_C suf_c;
      suf_c.kind_ = suf.kind_;
      suf_c.name_ = suf.name_.c_str();
      suf_c.table_ = suf.table_.c_str();
      suf_c.numval_ = suf.values_.size();
      suf_c.values_ = suf.values_.data();
      sol_data.suffixes_.push_back(std::move(suf_c));
    }
    result.n_primal_values_ = sol.x_.size();
    result.x_ = sol.x_.data();
    result.n_dual_values_ = sol.y_.size();
    result.y_ = sol.y_.data();
  }
  return result;
}